

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qframe.cpp
# Opt level: O0

void QFrame::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined4 s;
  Shape SVar2;
  Shadow SVar3;
  int iVar4;
  QRect *in_RCX;
  uint in_EDX;
  int in_ESI;
  QFrame *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  void *_v_1;
  void *_v;
  QFrame *_t;
  QFrame *in_stack_ffffffffffffffb0;
  QFrame *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    in_stack_ffffffffffffffc0 = *(QFrame **)in_RCX;
    in_stack_ffffffffffffffb0 = (QFrame *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffffb0) {
    case (QFrame *)0x0:
      SVar2 = frameShape(in_stack_ffffffffffffffb0);
      *(Shape *)&in_stack_ffffffffffffffc0->super_QWidget = SVar2;
      break;
    case (QFrame *)0x1:
      SVar3 = frameShadow(in_stack_ffffffffffffffb0);
      *(Shadow *)&in_stack_ffffffffffffffc0->super_QWidget = SVar3;
      break;
    case (QFrame *)0x2:
      iVar4 = lineWidth(in_stack_ffffffffffffffb0);
      *(int *)&in_stack_ffffffffffffffc0->super_QWidget = iVar4;
      break;
    case (QFrame *)0x3:
      iVar4 = midLineWidth(in_stack_ffffffffffffffb0);
      *(int *)&in_stack_ffffffffffffffc0->super_QWidget = iVar4;
      break;
    case (QFrame *)0x4:
      iVar4 = frameWidth(in_stack_ffffffffffffffb0);
      *(int *)&in_stack_ffffffffffffffc0->super_QWidget = iVar4;
      break;
    case (QFrame *)0x5:
      QVar5 = frameRect(in_RDI);
      local_18 = QVar5._0_8_;
      *(undefined8 *)&in_stack_ffffffffffffffc0->super_QWidget = local_18;
      local_10 = QVar5._8_8_;
      *(undefined8 *)&(in_stack_ffffffffffffffc0->super_QWidget).field_0x8 = local_10;
    }
  }
  if (in_ESI == 2) {
    s = in_RCX->y1;
    switch(in_EDX) {
    case 0:
      setFrameShape(in_stack_ffffffffffffffc0,s);
      break;
    case 1:
      setFrameShadow(in_stack_ffffffffffffffc0,s);
      break;
    case 2:
      setLineWidth(in_stack_ffffffffffffffb0,0);
      break;
    case 3:
      setMidLineWidth(in_stack_ffffffffffffffb0,0);
      break;
    default:
      break;
    case 5:
      setFrameRect((QFrame *)CONCAT44(2,in_EDX),in_RCX);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFrame::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFrame *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Shape*>(_v) = _t->frameShape(); break;
        case 1: *reinterpret_cast<Shadow*>(_v) = _t->frameShadow(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->lineWidth(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->midLineWidth(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->frameWidth(); break;
        case 5: *reinterpret_cast<QRect*>(_v) = _t->frameRect(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFrameShape(*reinterpret_cast<Shape*>(_v)); break;
        case 1: _t->setFrameShadow(*reinterpret_cast<Shadow*>(_v)); break;
        case 2: _t->setLineWidth(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setMidLineWidth(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setFrameRect(*reinterpret_cast<QRect*>(_v)); break;
        default: break;
        }
    }
}